

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

value * __thiscall mjs::value::operator=(value *this,value *rhs)

{
  wostream *os;
  wstring_view local_198;
  wostringstream _woss;
  
  destroy(this);
  switch(rhs->type_) {
  case undefined:
  case null:
    break;
  case boolean:
    (this->field_1).b_ = (rhs->field_1).b_;
    break;
  case number:
    (this->field_1).n_ = (rhs->field_1).n_;
    break;
  case string:
  case object:
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&(this->field_1).s_,(gc_heap_ptr_untyped *)&(rhs->field_1).s_)
    ;
    break;
  case reference:
    reference::reference(&(this->field_1).r_,&(rhs->field_1).r_);
    break;
  default:
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&_woss);
    os = std::operator<<((wostream *)&_woss,"Not implemented: ");
    mjs::operator<<(os,rhs->type_);
    std::__cxx11::wstringbuf::str();
    throw_runtime_error(&local_198,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                        ,0x43);
  }
  this->type_ = rhs->type_;
  return this;
}

Assistant:

value& value::operator=(value&& rhs) {
    destroy();
    switch (rhs.type_) {
    case value_type::undefined: break;
    case value_type::null:      break;
    case value_type::boolean:   b_ = rhs.b_; break;
    case value_type::number:    n_ = rhs.n_; break;
    case value_type::string:    new (&s_) string{std::move(rhs.s_)}; break;
    case value_type::object:    new (&o_) object_ptr{std::move(rhs.o_)}; break;
    case value_type::reference: new (&r_) reference{std::move(rhs.r_)}; break;
    default: NOT_IMPLEMENTED(rhs.type_);
    }
    type_ = rhs.type_;
    return *this;
}